

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trimesh_mscomplex.cpp
# Opt level: O0

void trimesh::get_contrib_cps<(trimesh::eGDIR)0,1>(mscomplex_ptr_t *msc,contrib_t *contrib)

{
  bool bVar1;
  uint uVar2;
  type pmVar3;
  type pmVar4;
  __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
  _Var5;
  reference t;
  type puVar6;
  char *pcVar7;
  type piVar8;
  type ppVar9;
  char *pcVar10;
  ostream *poVar11;
  runtime_error *prVar12;
  uint *puVar13;
  type piVar14;
  mapped_type *pmVar15;
  shared_ptr<trimesh::mscomplex_t> *this;
  int __c;
  int __c_00;
  int __c_01;
  int __c_02;
  int __c_03;
  true_ *in_R8;
  sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> sVar16;
  byte local_1a69;
  byte local_18e9;
  byte local_17f1;
  byte local_17c1;
  byte local_1791;
  byte local_1721;
  byte local_16e1;
  byte local_16b1;
  int local_1680;
  bool local_1679;
  int cp;
  bool _foreach_continue697;
  auto_any_base *local_15e0;
  auto_any_t _foreach_end697;
  auto_any_base *local_1540;
  auto_any_t _foreach_cur697;
  undefined8 local_1530;
  shared_ptr<trimesh::mscomplex_t> local_1520;
  bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  local_1510;
  filter_holder<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
  local_14f0;
  code *local_14d0;
  undefined8 local_14c8;
  shared_ptr<trimesh::mscomplex_t> local_14b8;
  bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  local_14a8;
  filter_holder<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
  local_1488;
  undefined1 local_1468 [120];
  filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>
  local_13f0;
  auto_any<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>_>
  local_12c0;
  foreach_detail_ *local_1190;
  auto_any_t _foreach_col697;
  string local_1180 [32];
  stringstream local_1160 [8];
  stringstream ss_5;
  ostream local_1150 [383];
  undefined1 local_fd1;
  string local_fd0 [32];
  stringstream local_fb0 [8];
  stringstream ss_4;
  ostream local_fa0 [383];
  undefined1 local_e21;
  string local_e20 [32];
  stringstream local_e00 [8];
  stringstream ss_3;
  ostream local_df0 [376];
  uint local_c78;
  bool local_c71;
  int ccp;
  bool _foreach_continue683;
  auto_any_base *local_c68;
  auto_any_t _foreach_end683;
  auto_any_base *local_c58;
  auto_any_t _foreach_cur683;
  auto_any_t local_c48;
  auto_any_t _foreach_col683;
  string local_c38 [32];
  stringstream local_c18 [8];
  stringstream ss_2;
  ostream local_c08 [383];
  undefined1 local_a89;
  string local_a88 [32];
  stringstream local_a68 [8];
  stringstream ss_1;
  ostream local_a58 [376];
  undefined1 local_8e0 [8];
  value_type pr_2;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> _Stack_8b8;
  bool _foreach_continue676;
  auto_any_base *local_8b0;
  auto_any_t _foreach_end676;
  auto_any_base *local_8a0;
  auto_any_t _foreach_cur676;
  auto_any_t local_890;
  auto_any_t _foreach_col676;
  int p_;
  bool _foreach_continue669;
  auto_any_base *local_878;
  auto_any_t _foreach_end669;
  auto_any_base *local_868;
  auto_any_t _foreach_cur669;
  auto_any_t local_858;
  auto_any_t _foreach_col669;
  int p_1;
  int_pair_t pr_1;
  bool _foreach_continue665;
  auto_any_t _foreach_end665;
  auto_any_base *local_758;
  auto_any_t _foreach_cur665;
  foreach_detail_ *local_748;
  auto_any_t _foreach_col665;
  string local_738 [32];
  stringstream local_718 [8];
  stringstream ss;
  ostream local_708 [376];
  int local_590;
  bool local_589;
  int qaqa;
  bool _foreach_continue648;
  auto_any_base *local_580;
  auto_any_t _foreach_end648;
  auto_any_base *local_570;
  auto_any_t _foreach_cur648;
  auto_any_t local_560;
  auto_any_t _foreach_col648;
  int qa;
  bool _foreach_continue636;
  auto_any_base *local_548;
  auto_any_t _foreach_end636;
  auto_any_base *local_538;
  auto_any_t _foreach_cur636;
  auto_any_t local_528;
  auto_any_t _foreach_col636;
  int_list_t *pcontrib;
  int local_510;
  int q;
  int p;
  int_pair_t pr;
  bool _foreach_continue629;
  auto_any_t _foreach_end629;
  auto_any_base *local_418;
  auto_any_t _foreach_cur629;
  reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
  local_408;
  auto_any<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  local_328;
  foreach_detail_ *local_248;
  auto_any_t _foreach_col629;
  shared_ptr<trimesh::mscomplex_t> local_238;
  bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  local_228;
  filter_holder<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
  local_210;
  shared_ptr<trimesh::mscomplex_t> local_1f0;
  bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  local_1e0;
  transform_holder<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
  local_1c8;
  sliced local_1a0;
  sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_> local_190;
  transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  local_180;
  undefined1 local_130 [8];
  remove_cv_ref_t<decltype(msc_>m_canc_list___badpt__sliced_0__msc_>m_multires_version____badpt__transformed_bind_order_by_dir_index<(trimesh::eGDIR)0U>__msc___1_____badpt__filtered_bind_is_dim_pair<1,_odim>__msc___1___>
  canc_rng;
  contrib_t contrib_map;
  int odim;
  eGDIR odir;
  contrib_t *contrib_local;
  mscomplex_ptr_t *msc_local;
  
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
         *)((long)&canc_rng.
                   super_iterator_range<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
                   .
                   super_iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::bidirectional_traversal_tag>
                   .
                   super_iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::incrementable_traversal_tag>
                   .m_End.m_end.m_f + 0x18));
  pmVar3 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
  pmVar4 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
  boost::adaptors::sliced::sliced(&local_1a0,0,(long)pmVar4->m_multires_version);
  sVar16 = boost::adaptors::operator|(&pmVar3->m_canc_list,&local_1a0);
  local_190.
  super_iterator_range<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_End._M_current =
       sVar16.
       super_iterator_range<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::iterators::random_access_traversal_tag>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::iterators::incrementable_traversal_tag>
       .m_End._M_current;
  _Var5._M_current =
       sVar16.
       super_iterator_range<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::iterators::random_access_traversal_tag>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
       .
       super_iterator_range_base<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::iterators::incrementable_traversal_tag>
       .m_Begin._M_current;
  local_190.
  super_iterator_range<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::iterators::random_access_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::iterators::bidirectional_traversal_tag>
  .
  super_iterator_range_base<__gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::iterators::incrementable_traversal_tag>
  .m_Begin._M_current = _Var5._M_current;
  boost::shared_ptr<trimesh::mscomplex_t>::shared_ptr(&local_1f0,msc);
  boost::
  bind<std::pair<int,int>,boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>,boost::shared_ptr<trimesh::mscomplex_t>,boost::arg<1>>
            (&local_1e0,(boost *)order_by_dir_index<(trimesh::eGDIR)0>,&local_1f0);
  boost::range_detail::forwarder<boost::range_detail::transform_holder>::operator()
            (&local_1c8,
             (forwarder<boost::range_detail::transform_holder> *)
             &boost::adaptors::(anonymous_namespace)::transformed,&local_1e0);
  boost::range_detail::operator|(&local_180,&local_190,&local_1c8);
  boost::shared_ptr<trimesh::mscomplex_t>::shared_ptr(&local_238,msc);
  boost::
  bind<bool,boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>,boost::shared_ptr<trimesh::mscomplex_t>,boost::arg<1>>
            (&local_228,(boost *)is_dim_pair<1,0>,&local_238);
  boost::range_detail::forwarder<boost::range_detail::filter_holder>::operator()
            (&local_210,
             (forwarder<boost::range_detail::filter_holder> *)
             &boost::adaptors::(anonymous_namespace)::filtered,&local_228);
  boost::range_detail::operator|
            ((filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
              *)local_130,&local_180,&local_210);
  boost::range_detail::
  filter_holder<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
  ::~filter_holder(&local_210);
  boost::_bi::
  bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  ::~bind_t(&local_228);
  boost::shared_ptr<trimesh::mscomplex_t>::~shared_ptr(&local_238);
  boost::range_detail::
  transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>
  ::~transformed_range(&local_180);
  boost::range_detail::
  transform_holder<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
  ::~transform_holder(&local_1c8);
  boost::_bi::
  bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  ::~bind_t(&local_1e0);
  boost::shared_ptr<trimesh::mscomplex_t>::~shared_ptr(&local_1f0);
  boost::range_detail::operator|(&local_408,local_130);
  boost::foreach_detail_::
  contain<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>>>
            (&local_328,(foreach_detail_ *)&local_408,
             (reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
              *)0x0,(true_ *)_Var5._M_current);
  boost::range_detail::
  reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>
  ::~reversed_range(&local_408);
  local_248 = (foreach_detail_ *)&local_328;
  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool((auto_any_base *)local_248);
  if (!bVar1) {
    boost::foreach_detail_::
    begin<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>>,mpl_::bool_<true>>
              ((auto_any<boost::iterators::reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>_>
                *)&_foreach_end629,local_248,(auto_any_t)0x0,
               (type2type<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>,_mpl_::bool_<true>_>
                *)0x0,in_R8);
    local_418 = (auto_any_base *)&_foreach_end629;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_418);
    if (!bVar1) {
      boost::foreach_detail_::
      end<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>>,mpl_::bool_<true>>
                ((auto_any<boost::iterators::reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>_>
                  *)&pr.second,local_248,(auto_any_t)0x0,
                 (type2type<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>,_mpl_::bool_<true>_>
                  *)0x0,in_R8);
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool
                        ((auto_any_base *)&pr.second);
      if (!bVar1) {
        pr.first._3_1_ = 1;
        while( true ) {
          local_16b1 = 0;
          if ((pr.first._3_1_ & 1) != 0) {
            bVar1 = boost::foreach_detail_::
                    done<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>>,mpl_::bool_<true>>
                              (local_418,(auto_any_t)&pr.second,
                               (type2type<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>,_mpl_::bool_<true>_>
                                *)0x0);
            local_16b1 = bVar1 ^ 0xff;
          }
          if ((local_16b1 & 1) == 0) break;
          bVar1 = boost::foreach_detail_::set_false((bool *)((long)&pr.first + 3));
          if (!bVar1) {
            _q = boost::foreach_detail_::
                 deref<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>>,mpl_::bool_<true>>
                           (local_418,
                            (type2type<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>,_mpl_::bool_<true>_>
                             *)0x0);
            while (((pr.first._3_1_ ^ 0xff) & 1) != 0) {
              local_510 = q;
              pcontrib._4_4_ = p;
              _foreach_col636 =
                   (auto_any_t)
                   std::
                   map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                   ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                 *)((long)&canc_rng.
                                           super_iterator_range<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
                                           .
                                           super_iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::bidirectional_traversal_tag>
                                           .
                                           super_iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::incrementable_traversal_tag>
                                           .m_End.m_end.m_f + 0x18),&local_510);
              pmVar3 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
              t = std::
                  vector<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                  ::operator[](pmVar3->m_conn + 1,(long)(int)pcontrib._4_4_);
              _foreach_cur636 =
                   (auto_any_t)
                   boost::foreach_detail_::
                   contain<std::multiset<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>>
                             (t,(false_ *)0x0);
              local_528 = (auto_any_t)&_foreach_cur636;
              bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_528);
              if (!bVar1) {
                _foreach_end636 =
                     (auto_any_t)
                     boost::foreach_detail_::
                     begin<std::multiset<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,mpl_::bool_<false>>
                               (local_528,
                                (type2type<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_mpl_::bool_<false>_>
                                 *)0x0,(false_ *)0x0);
                local_538 = (auto_any_base *)&_foreach_end636;
                bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_538);
                if (!bVar1) {
                  _qa = (_Base_ptr)
                        boost::foreach_detail_::
                        end<std::multiset<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,mpl_::bool_<false>>
                                  (local_528,
                                   (type2type<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_mpl_::bool_<false>_>
                                    *)0x0,(false_ *)0x0);
                  local_548 = (auto_any_base *)&qa;
                  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_548);
                  if (!bVar1) {
                    _foreach_col648._7_1_ = 1;
                    while( true ) {
                      local_16e1 = 0;
                      if ((_foreach_col648._7_1_ & 1) != 0) {
                        bVar1 = boost::foreach_detail_::
                                done<std::multiset<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,mpl_::bool_<false>>
                                          (local_538,local_548,
                                           (type2type<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_mpl_::bool_<false>_>
                                            *)0x0);
                        local_16e1 = bVar1 ^ 0xff;
                      }
                      if ((local_16e1 & 1) == 0) break;
                      bVar1 = boost::foreach_detail_::set_false
                                        ((bool *)((long)&_foreach_col648 + 7));
                      if (!bVar1) {
                        puVar6 = boost::foreach_detail_::
                                 deref<std::multiset<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,mpl_::bool_<false>>
                                           (local_538,
                                            (type2type<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_mpl_::bool_<false>_>
                                             *)0x0);
                        _foreach_col648._0_4_ = *puVar6;
                        while (((_foreach_col648._7_1_ ^ 0xff) & 1) != 0) {
                          pmVar3 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
                          bVar1 = mscomplex_t::is_not_paired(pmVar3,(uint)_foreach_col648);
                          if (bVar1) {
                            std::vector<int,_std::allocator<int>_>::push_back
                                      ((vector<int,_std::allocator<int>_> *)_foreach_col636,
                                       (value_type_conflict2 *)&_foreach_col648);
                          }
                          else {
                            pmVar3 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
                            pcVar10 = mscomplex_t::index(pmVar3,(char *)(ulong)pcontrib._4_4_,__c);
                            pmVar3 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
                            pmVar4 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
                            uVar2 = mscomplex_t::pair_idx(pmVar4,(uint)_foreach_col648);
                            pcVar7 = mscomplex_t::index(pmVar3,(char *)(ulong)uVar2,__c_00);
                            if ((int)pcVar10 == (int)pcVar7) {
                              pmVar15 = std::
                                        map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                        ::operator[]((
                                                  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                                  *)((long)&canc_rng.
                                                  super_iterator_range<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
                                                  .
                                                  super_iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::bidirectional_traversal_tag>
                                                  .
                                                  super_iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::incrementable_traversal_tag>
                                                  .m_End.m_end.m_f + 0x18),
                                                  (key_type *)&_foreach_col648);
                              _foreach_cur648 =
                                   (auto_any_t)
                                   boost::foreach_detail_::
                                   contain<std::vector<int,std::allocator<int>>>
                                             (pmVar15,(false_ *)0x0);
                              local_560 = (auto_any_t)&_foreach_cur648;
                              bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool
                                                (local_560);
                              if (!bVar1) {
                                _foreach_end648 =
                                     (auto_any_t)
                                     boost::foreach_detail_::
                                     begin<std::vector<int,std::allocator<int>>,mpl_::bool_<false>>
                                               (local_560,
                                                (type2type<std::vector<int,_std::allocator<int>_>,_mpl_::bool_<false>_>
                                                 *)0x0,(false_ *)0x0);
                                local_570 = (auto_any_base *)&_foreach_end648;
                                bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool
                                                  (local_570);
                                if (!bVar1) {
                                  _qaqa = (int *)boost::foreach_detail_::
                                                 end<std::vector<int,std::allocator<int>>,mpl_::bool_<false>>
                                                           (local_560,
                                                            (
                                                  type2type<std::vector<int,_std::allocator<int>_>,_mpl_::bool_<false>_>
                                                  *)0x0,(false_ *)0x0);
                                  local_580 = (auto_any_base *)&qaqa;
                                  bVar1 = boost::foreach_detail_::auto_any_base::
                                          operator_cast_to_bool(local_580);
                                  if (!bVar1) {
                                    local_589 = true;
                                    while( true ) {
                                      local_1721 = 0;
                                      if ((local_589 & 1U) != 0) {
                                        bVar1 = boost::foreach_detail_::
                                                done<std::vector<int,std::allocator<int>>,mpl_::bool_<false>>
                                                          (local_570,local_580,
                                                           (
                                                  type2type<std::vector<int,_std::allocator<int>_>,_mpl_::bool_<false>_>
                                                  *)0x0);
                                        local_1721 = bVar1 ^ 0xff;
                                      }
                                      if ((local_1721 & 1) == 0) break;
                                      bVar1 = boost::foreach_detail_::set_false(&local_589);
                                      if (!bVar1) {
                                        piVar8 = boost::foreach_detail_::
                                                 deref<std::vector<int,std::allocator<int>>,mpl_::bool_<false>>
                                                           (local_570,
                                                            (
                                                  type2type<std::vector<int,_std::allocator<int>_>,_mpl_::bool_<false>_>
                                                  *)0x0);
                                        local_590 = *piVar8;
                                        while (((local_589 ^ 0xffU) & 1) != 0) {
                                          std::vector<int,_std::allocator<int>_>::push_back
                                                    ((vector<int,_std::allocator<int>_> *)
                                                     _foreach_col636,&local_590);
                                          pmVar3 = boost::shared_ptr<trimesh::mscomplex_t>::
                                                   operator->(msc);
                                          bVar1 = mscomplex_t::is_not_paired(pmVar3,local_590);
                                          if (!bVar1) {
                                            std::__cxx11::stringstream::stringstream(local_718);
                                            poVar11 = std::operator<<(local_708,
                                                                      "Failed to assert condition ")
                                            ;
                                            poVar11 = std::operator<<(poVar11,
                                                  "msc->is_not_paired(qaqa)");
                                            poVar11 = std::operator<<(poVar11,"\n");
                                            poVar11 = std::operator<<(poVar11,"at (");
                                            poVar11 = std::operator<<(poVar11,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                                                  );
                                            poVar11 = std::operator<<(poVar11,",");
                                            poVar11 = std::operator<<(poVar11,"get_contrib_cps");
                                            poVar11 = std::operator<<(poVar11,",");
                                            poVar11 = (ostream *)
                                                      std::ostream::operator<<(poVar11,0x28e);
                                            std::operator<<(poVar11,") \n ");
                                            _foreach_col665._7_1_ = 1;
                                            prVar12 = (runtime_error *)
                                                      __cxa_allocate_exception(0x10);
                                            std::__cxx11::stringstream::str();
                                            std::runtime_error::runtime_error(prVar12,local_738);
                                            _foreach_col665._7_1_ = 0;
                                            __cxa_throw(prVar12,&std::runtime_error::typeinfo,
                                                        std::runtime_error::~runtime_error);
                                          }
                                          local_589 = true;
                                        }
                                      }
                                      if ((local_589 & 1U) != 0) {
                                        boost::foreach_detail_::
                                        next<std::vector<int,std::allocator<int>>,mpl_::bool_<false>>
                                                  (local_570,
                                                   (
                                                  type2type<std::vector<int,_std::allocator<int>_>,_mpl_::bool_<false>_>
                                                  *)0x0);
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                          _foreach_col648._7_1_ = 1;
                        }
                      }
                      if ((_foreach_col648._7_1_ & 1) != 0) {
                        boost::foreach_detail_::
                        next<std::multiset<unsigned_int,std::less<unsigned_int>,std::allocator<unsigned_int>>,mpl_::bool_<false>>
                                  (local_538,
                                   (type2type<std::multiset<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_mpl_::bool_<false>_>
                                    *)0x0);
                      }
                    }
                  }
                }
              }
              pr.first._3_1_ = 1;
            }
          }
          if ((pr.first._3_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>>,mpl_::bool_<true>>
                      (local_418,
                       (type2type<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>,_mpl_::bool_<true>_>
                        *)0x0);
          }
        }
      }
      boost::foreach_detail_::
      auto_any<boost::iterators::reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>_>
      ::~auto_any((auto_any<boost::iterators::reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>_>
                   *)&pr.second);
    }
    boost::foreach_detail_::
    auto_any<boost::iterators::reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>_>
    ::~auto_any((auto_any<boost::iterators::reverse_iterator<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>_>
                 *)&_foreach_end629);
  }
  boost::foreach_detail_::
  auto_any<boost::range_detail::reversed_range<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>_>_>
  ::~auto_any(&local_328);
  _foreach_cur665 =
       (auto_any_t)
       boost::foreach_detail_::
       contain<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>>
                 ((filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                   *)local_130,(false_ *)0x0);
  local_748 = (foreach_detail_ *)&_foreach_cur665;
  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool((auto_any_base *)local_748);
  if (!bVar1) {
    boost::foreach_detail_::
    begin<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>,mpl_::bool_<false>>
              ((auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
                *)&_foreach_end665,local_748,(auto_any_t)0x0,
               (type2type<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_mpl_::bool_<false>_>
                *)0x0,(false_ *)in_R8);
    local_758 = (auto_any_base *)&_foreach_end665;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_758);
    if (!bVar1) {
      boost::foreach_detail_::
      end<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>,mpl_::bool_<false>>
                ((auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
                  *)&pr_1.second,local_748,(auto_any_t)0x0,
                 (type2type<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_mpl_::bool_<false>_>
                  *)0x0,(false_ *)in_R8);
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool
                        ((auto_any_base *)&pr_1.second);
      if (!bVar1) {
        pr_1.first._3_1_ = 1;
        while( true ) {
          local_1791 = 0;
          if ((pr_1.first._3_1_ & 1) != 0) {
            bVar1 = boost::foreach_detail_::
                    done<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>,mpl_::bool_<false>>
                              (local_758,(auto_any_t)&pr_1.second,
                               (type2type<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_mpl_::bool_<false>_>
                                *)0x0);
            local_1791 = bVar1 ^ 0xff;
          }
          if ((local_1791 & 1) == 0) break;
          bVar1 = boost::foreach_detail_::set_false((bool *)((long)&pr_1.first + 3));
          if (!bVar1) {
            register0x00000000 =
                 boost::foreach_detail_::
                 deref<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>,mpl_::bool_<false>>
                           (local_758,
                            (type2type<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_mpl_::bool_<false>_>
                             *)0x0);
            while (((pr_1.first._3_1_ ^ 0xff) & 1) != 0) {
              _foreach_col669._0_4_ = _foreach_col669._4_4_;
              pmVar15 = std::
                        map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                        ::operator[]((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                      *)((long)&canc_rng.
                                                super_iterator_range<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
                                                .
                                                super_iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::bidirectional_traversal_tag>
                                                .
                                                super_iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::incrementable_traversal_tag>
                                                .m_End.m_end.m_f + 0x18),
                                     (key_type *)&_foreach_col669);
              _foreach_cur669 =
                   (auto_any_t)
                   boost::foreach_detail_::contain<std::vector<int,std::allocator<int>>>
                             (pmVar15,(false_ *)0x0);
              local_858 = (auto_any_t)&_foreach_cur669;
              bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_858);
              if (!bVar1) {
                _foreach_end669 =
                     (auto_any_t)
                     boost::foreach_detail_::
                     begin<std::vector<int,std::allocator<int>>,mpl_::bool_<false>>
                               (local_858,
                                (type2type<std::vector<int,_std::allocator<int>_>,_mpl_::bool_<false>_>
                                 *)0x0,(false_ *)0x0);
                local_868 = (auto_any_base *)&_foreach_end669;
                bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_868);
                if (!bVar1) {
                  _p_ = (int *)boost::foreach_detail_::
                               end<std::vector<int,std::allocator<int>>,mpl_::bool_<false>>
                                         (local_858,
                                          (type2type<std::vector<int,_std::allocator<int>_>,_mpl_::bool_<false>_>
                                           *)0x0,(false_ *)0x0);
                  local_878 = (auto_any_base *)&p_;
                  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_878);
                  if (!bVar1) {
                    _foreach_col676._7_1_ = 1;
                    while( true ) {
                      local_17c1 = 0;
                      if ((_foreach_col676._7_1_ & 1) != 0) {
                        bVar1 = boost::foreach_detail_::
                                done<std::vector<int,std::allocator<int>>,mpl_::bool_<false>>
                                          (local_868,local_878,
                                           (type2type<std::vector<int,_std::allocator<int>_>,_mpl_::bool_<false>_>
                                            *)0x0);
                        local_17c1 = bVar1 ^ 0xff;
                      }
                      if ((local_17c1 & 1) == 0) break;
                      bVar1 = boost::foreach_detail_::set_false
                                        ((bool *)((long)&_foreach_col676 + 7));
                      if (!bVar1) {
                        piVar8 = boost::foreach_detail_::
                                 deref<std::vector<int,std::allocator<int>>,mpl_::bool_<false>>
                                           (local_868,
                                            (type2type<std::vector<int,_std::allocator<int>_>,_mpl_::bool_<false>_>
                                             *)0x0);
                        _foreach_col676._0_4_ = *piVar8;
                        while (((_foreach_col676._7_1_ ^ 0xff) & 1) != 0) {
                          pmVar15 = std::
                                    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                                    ::operator[](contrib,(key_type *)&_foreach_col676);
                          std::vector<int,_std::allocator<int>_>::push_back
                                    (pmVar15,(value_type_conflict2 *)&_foreach_col669);
                          _foreach_col676._7_1_ = 1;
                        }
                      }
                      if ((_foreach_col676._7_1_ & 1) != 0) {
                        boost::foreach_detail_::
                        next<std::vector<int,std::allocator<int>>,mpl_::bool_<false>>
                                  (local_868,
                                   (type2type<std::vector<int,_std::allocator<int>_>,_mpl_::bool_<false>_>
                                    *)0x0);
                      }
                    }
                  }
                }
              }
              pr_1.first._3_1_ = 1;
            }
          }
          if ((pr_1.first._3_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,bool(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,int>,std::pair<int,int>(*)(boost::shared_ptr<trimesh::mscomplex_t>,std::pair<int,int>),boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::adaptors::sliced_range<std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>>const>const>,mpl_::bool_<false>>
                      (local_758,
                       (type2type<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>,_mpl_::bool_<false>_>
                        *)0x0);
          }
        }
      }
      boost::foreach_detail_::
      auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
      ::~auto_any((auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
                   *)&pr_1.second);
    }
    boost::foreach_detail_::
    auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
    ::~auto_any((auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
                 *)&_foreach_end665);
  }
  _foreach_cur676 =
       (auto_any_t)
       boost::foreach_detail_::
       contain<std::map<int,std::vector<int,std::allocator<int>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>>
                 (contrib,(false_ *)0x0);
  local_890 = (auto_any_t)&_foreach_cur676;
  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_890);
  if (!bVar1) {
    _foreach_end676 =
         (auto_any_t)
         boost::foreach_detail_::
         begin<std::map<int,std::vector<int,std::allocator<int>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>,mpl_::bool_<false>>
                   (local_890,
                    (type2type<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_mpl_::bool_<false>_>
                     *)0x0,(false_ *)0x0);
    local_8a0 = (auto_any_base *)&_foreach_end676;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_8a0);
    if (!bVar1) {
      _Stack_8b8._M_node =
           (_Base_ptr)
           boost::foreach_detail_::
           end<std::map<int,std::vector<int,std::allocator<int>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>,mpl_::bool_<false>>
                     (local_890,
                      (type2type<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_mpl_::bool_<false>_>
                       *)0x0,(false_ *)0x0);
      local_8b0 = (auto_any_base *)&stack0xfffffffffffff748;
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_8b0);
      if (!bVar1) {
        pr_2.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._7_1_ = 1;
        while( true ) {
          local_17f1 = 0;
          if ((pr_2.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
            bVar1 = boost::foreach_detail_::
                    done<std::map<int,std::vector<int,std::allocator<int>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>,mpl_::bool_<false>>
                              (local_8a0,local_8b0,
                               (type2type<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_mpl_::bool_<false>_>
                                *)0x0);
            local_17f1 = bVar1 ^ 0xff;
          }
          if ((local_17f1 & 1) == 0) break;
          bVar1 = boost::foreach_detail_::set_false
                            ((bool *)((long)&pr_2.second.
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_end_of_storage + 7));
          if (!bVar1) {
            ppVar9 = boost::foreach_detail_::
                     deref<std::map<int,std::vector<int,std::allocator<int>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>,mpl_::bool_<false>>
                               (local_8a0,
                                (type2type<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_mpl_::bool_<false>_>
                                 *)0x0);
            std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::pair
                      ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_8e0,ppVar9)
            ;
            while (((pr_2.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._7_1_ ^ 0xff) & 1) != 0) {
              pmVar3 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
              pcVar10 = mscomplex_t::index(pmVar3,(char *)(ulong)(uint)local_8e0._0_4_,__c_01);
              if ((int)pcVar10 != 1) {
                std::__cxx11::stringstream::stringstream(local_a68);
                poVar11 = std::operator<<(local_a58,"Failed to ensure condition ");
                poVar11 = std::operator<<(poVar11,"msc->index(pr.first) == dim");
                poVar11 = std::operator<<(poVar11,"\n");
                poVar11 = std::operator<<(poVar11,"at (");
                poVar11 = std::operator<<(poVar11,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                                         );
                poVar11 = std::operator<<(poVar11,",");
                poVar11 = std::operator<<(poVar11,"get_contrib_cps");
                poVar11 = std::operator<<(poVar11,",");
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x2a7);
                poVar11 = std::operator<<(poVar11,") \n ");
                poVar11 = std::operator<<(poVar11,"Message : ");
                poVar11 = std::operator<<(poVar11,"\"Computed the contribution of index != dim\"");
                std::operator<<(poVar11,"\n");
                local_a89 = 1;
                prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringstream::str();
                std::runtime_error::runtime_error(prVar12,local_a88);
                local_a89 = 0;
                __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              pmVar3 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
              bVar1 = mscomplex_t::is_not_paired(pmVar3,local_8e0._0_4_);
              if (!bVar1) {
                std::__cxx11::stringstream::stringstream(local_c18);
                poVar11 = std::operator<<(local_c08,"Failed to ensure condition ");
                poVar11 = std::operator<<(poVar11,"msc->is_not_paired(pr.first)");
                poVar11 = std::operator<<(poVar11,"\n");
                poVar11 = std::operator<<(poVar11,"at (");
                poVar11 = std::operator<<(poVar11,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                                         );
                poVar11 = std::operator<<(poVar11,",");
                poVar11 = std::operator<<(poVar11,"get_contrib_cps");
                poVar11 = std::operator<<(poVar11,",");
                poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x2a9);
                poVar11 = std::operator<<(poVar11,") \n ");
                poVar11 = std::operator<<(poVar11,"Message : ");
                poVar11 = std::operator<<(poVar11,"\"Computed the contribution to a cancelled cp\"")
                ;
                std::operator<<(poVar11,"\n");
                _foreach_col683._7_1_ = 1;
                prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::__cxx11::stringstream::str();
                std::runtime_error::runtime_error(prVar12,local_c38);
                _foreach_col683._7_1_ = 0;
                __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error
                           );
              }
              _foreach_cur683 =
                   (auto_any_t)
                   boost::foreach_detail_::contain<std::vector<int,std::allocator<int>>>
                             ((vector<int,_std::allocator<int>_> *)&pr_2,(false_ *)0x0);
              local_c48 = (auto_any_t)&_foreach_cur683;
              bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_c48);
              if (!bVar1) {
                _foreach_end683 =
                     (auto_any_t)
                     boost::foreach_detail_::
                     begin<std::vector<int,std::allocator<int>>,mpl_::bool_<false>>
                               (local_c48,
                                (type2type<std::vector<int,_std::allocator<int>_>,_mpl_::bool_<false>_>
                                 *)0x0,(false_ *)0x0);
                local_c58 = (auto_any_base *)&_foreach_end683;
                bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_c58);
                if (!bVar1) {
                  _ccp = (int *)boost::foreach_detail_::
                                end<std::vector<int,std::allocator<int>>,mpl_::bool_<false>>
                                          (local_c48,
                                           (type2type<std::vector<int,_std::allocator<int>_>,_mpl_::bool_<false>_>
                                            *)0x0,(false_ *)0x0);
                  local_c68 = (auto_any_base *)&ccp;
                  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_c68);
                  if (!bVar1) {
                    local_c71 = true;
                    while( true ) {
                      local_18e9 = 0;
                      if ((local_c71 & 1U) != 0) {
                        bVar1 = boost::foreach_detail_::
                                done<std::vector<int,std::allocator<int>>,mpl_::bool_<false>>
                                          (local_c58,local_c68,
                                           (type2type<std::vector<int,_std::allocator<int>_>,_mpl_::bool_<false>_>
                                            *)0x0);
                        local_18e9 = bVar1 ^ 0xff;
                      }
                      if ((local_18e9 & 1) == 0) break;
                      bVar1 = boost::foreach_detail_::set_false(&local_c71);
                      if (!bVar1) {
                        puVar13 = (uint *)boost::foreach_detail_::
                                          deref<std::vector<int,std::allocator<int>>,mpl_::bool_<false>>
                                                    (local_c58,
                                                     (
                                                  type2type<std::vector<int,_std::allocator<int>_>,_mpl_::bool_<false>_>
                                                  *)0x0);
                        local_c78 = *puVar13;
                        while (((local_c71 ^ 0xffU) & 1) != 0) {
                          pmVar3 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
                          pcVar10 = mscomplex_t::index(pmVar3,(char *)(ulong)local_c78,__c_02);
                          if ((int)pcVar10 != 1) {
                            std::__cxx11::stringstream::stringstream(local_e00);
                            poVar11 = std::operator<<(local_df0,"Failed to ensure condition ");
                            poVar11 = std::operator<<(poVar11,"msc->index(ccp) == dim");
                            poVar11 = std::operator<<(poVar11,"\n");
                            poVar11 = std::operator<<(poVar11,"at (");
                            poVar11 = std::operator<<(poVar11,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                                                  );
                            poVar11 = std::operator<<(poVar11,",");
                            poVar11 = std::operator<<(poVar11,"get_contrib_cps");
                            poVar11 = std::operator<<(poVar11,",");
                            poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x2ae);
                            poVar11 = std::operator<<(poVar11,") \n ");
                            poVar11 = std::operator<<(poVar11,"Message : ");
                            poVar11 = std::operator<<(poVar11,
                                                  "\"other dim cp is attempting to contribute\"");
                            std::operator<<(poVar11,"\n");
                            local_e21 = 1;
                            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::__cxx11::stringstream::str();
                            std::runtime_error::runtime_error(prVar12,local_e20);
                            local_e21 = 0;
                            __cxa_throw(prVar12,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          pmVar3 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
                          bVar1 = mscomplex_t::is_paired(pmVar3,local_c78);
                          if (!bVar1) {
                            std::__cxx11::stringstream::stringstream(local_fb0);
                            poVar11 = std::operator<<(local_fa0,"Failed to ensure condition ");
                            poVar11 = std::operator<<(poVar11,"msc->is_paired(ccp)");
                            poVar11 = std::operator<<(poVar11,"\n");
                            poVar11 = std::operator<<(poVar11,"at (");
                            poVar11 = std::operator<<(poVar11,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                                                  );
                            poVar11 = std::operator<<(poVar11,",");
                            poVar11 = std::operator<<(poVar11,"get_contrib_cps");
                            poVar11 = std::operator<<(poVar11,",");
                            poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x2b0);
                            poVar11 = std::operator<<(poVar11,") \n ");
                            poVar11 = std::operator<<(poVar11,"Message : ");
                            poVar11 = std::operator<<(poVar11,
                                                  "\"an unpaired cp is attempting to contribute\"");
                            std::operator<<(poVar11,"\n");
                            local_fd1 = 1;
                            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::__cxx11::stringstream::str();
                            std::runtime_error::runtime_error(prVar12,local_fd0);
                            local_fd1 = 0;
                            __cxa_throw(prVar12,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          pmVar3 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
                          pmVar4 = boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
                          uVar2 = mscomplex_t::pair_idx(pmVar4,local_c78);
                          pcVar10 = mscomplex_t::index(pmVar3,(char *)(ulong)uVar2,__c_03);
                          if ((int)pcVar10 != 0) {
                            std::__cxx11::stringstream::stringstream(local_1160);
                            poVar11 = std::operator<<(local_1150,"Failed to ensure condition ");
                            poVar11 = std::operator<<(poVar11,
                                                  "msc->index(msc->pair_idx(ccp)) == odim");
                            poVar11 = std::operator<<(poVar11,"\n");
                            poVar11 = std::operator<<(poVar11,"at (");
                            poVar11 = std::operator<<(poVar11,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/nithins[P]mscomplex-tri/core/trimesh_mscomplex.cpp"
                                                  );
                            poVar11 = std::operator<<(poVar11,",");
                            poVar11 = std::operator<<(poVar11,"get_contrib_cps");
                            poVar11 = std::operator<<(poVar11,",");
                            poVar11 = (ostream *)std::ostream::operator<<(poVar11,0x2b2);
                            poVar11 = std::operator<<(poVar11,") \n ");
                            poVar11 = std::operator<<(poVar11,"Message : ");
                            poVar11 = std::operator<<(poVar11,
                                                  "\"wrong cancellation type cp is attempting to contribute\""
                                                  );
                            std::operator<<(poVar11,"\n");
                            _foreach_col697._7_1_ = 1;
                            prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
                            std::__cxx11::stringstream::str();
                            std::runtime_error::runtime_error(prVar12,local_1180);
                            _foreach_col697._7_1_ = 0;
                            __cxa_throw(prVar12,&std::runtime_error::typeinfo,
                                        std::runtime_error::~runtime_error);
                          }
                          local_c71 = true;
                        }
                      }
                      if ((local_c71 & 1U) != 0) {
                        boost::foreach_detail_::
                        next<std::vector<int,std::allocator<int>>,mpl_::bool_<false>>
                                  (local_c58,
                                   (type2type<std::vector<int,_std::allocator<int>_>,_mpl_::bool_<false>_>
                                    *)0x0);
                      }
                    }
                  }
                }
              }
              pr_2.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
            }
            std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair
                      ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)local_8e0);
          }
          if ((pr_2.second.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage._7_1_ & 1) != 0) {
            boost::foreach_detail_::
            next<std::map<int,std::vector<int,std::allocator<int>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<int,std::allocator<int>>>>>,mpl_::bool_<false>>
                      (local_8a0,
                       (type2type<std::map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>,_mpl_::bool_<false>_>
                        *)0x0);
          }
        }
      }
    }
  }
  boost::shared_ptr<trimesh::mscomplex_t>::operator->(msc);
  mscomplex_t::cp_range((mscomplex_t *)local_1468);
  boost::shared_ptr<trimesh::mscomplex_t>::shared_ptr(&local_14b8,msc);
  local_14d0 = mscomplex_t::is_not_paired;
  local_14c8 = 0;
  boost::bind<bool,trimesh::mscomplex_t,int,boost::shared_ptr<trimesh::mscomplex_t>,boost::arg<1>>
            (&local_14a8,(boost *)mscomplex_t::is_not_paired,0,&local_14b8);
  boost::range_detail::forwarder<boost::range_detail::filter_holder>::operator()
            (&local_1488,
             (forwarder<boost::range_detail::filter_holder> *)
             &boost::adaptors::(anonymous_namespace)::filtered,&local_14a8);
  boost::range_detail::operator|
            ((filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
              *)(local_1468 + 8),
             (iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>
              *)local_1468,&local_1488);
  this = &local_1520;
  boost::shared_ptr<trimesh::mscomplex_t>::shared_ptr(this,msc);
  _foreach_cur697 = (auto_any_t)mscomplex_t::is_index_i_cp<1>;
  local_1530 = 0;
  boost::bind<bool,trimesh::mscomplex_t,int,boost::shared_ptr<trimesh::mscomplex_t>,boost::arg<1>>
            (&local_1510,(boost *)mscomplex_t::is_index_i_cp<1>,0);
  boost::range_detail::forwarder<boost::range_detail::filter_holder>::operator()
            (&local_14f0,
             (forwarder<boost::range_detail::filter_holder> *)
             &boost::adaptors::(anonymous_namespace)::filtered,&local_1510);
  boost::range_detail::operator|
            (&local_13f0,
             (filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
              *)(local_1468 + 8),&local_14f0);
  boost::foreach_detail_::
  contain<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::iterator_range<boost::iterators::counting_iterator<int,boost::use_default,boost::use_default>>const>const>>
            (&local_12c0,(foreach_detail_ *)&local_13f0,
             (filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>
              *)0x0,(true_ *)this);
  boost::range_detail::
  filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>
  ::~filtered_range(&local_13f0);
  boost::range_detail::
  filter_holder<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
  ::~filter_holder(&local_14f0);
  boost::_bi::
  bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  ::~bind_t(&local_1510);
  boost::shared_ptr<trimesh::mscomplex_t>::~shared_ptr(&local_1520);
  boost::range_detail::
  filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
  ::~filtered_range((filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>
                     *)(local_1468 + 8));
  boost::range_detail::
  filter_holder<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>_>
  ::~filter_holder(&local_1488);
  boost::_bi::
  bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>
  ::~bind_t(&local_14a8);
  boost::shared_ptr<trimesh::mscomplex_t>::~shared_ptr(&local_14b8);
  local_1190 = (foreach_detail_ *)&local_12c0;
  bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool((auto_any_base *)local_1190);
  if (!bVar1) {
    boost::foreach_detail_::
    begin<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::iterator_range<boost::iterators::counting_iterator<int,boost::use_default,boost::use_default>>const>const>,mpl_::bool_<true>>
              ((auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>
                *)&_foreach_end697,local_1190,(auto_any_t)0x0,
               (type2type<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>,_mpl_::bool_<true>_>
                *)0x0,in_R8);
    local_1540 = (auto_any_base *)&_foreach_end697;
    bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_1540);
    if (!bVar1) {
      boost::foreach_detail_::
      end<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::iterator_range<boost::iterators::counting_iterator<int,boost::use_default,boost::use_default>>const>const>,mpl_::bool_<true>>
                ((auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>
                  *)&cp,local_1190,(auto_any_t)0x0,
                 (type2type<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>,_mpl_::bool_<true>_>
                  *)0x0,in_R8);
      local_15e0 = (auto_any_base *)&cp;
      bVar1 = boost::foreach_detail_::auto_any_base::operator_cast_to_bool(local_15e0);
      if (!bVar1) {
        local_1679 = true;
        while( true ) {
          local_1a69 = 0;
          if ((local_1679 & 1U) != 0) {
            bVar1 = boost::foreach_detail_::
                    done<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::iterator_range<boost::iterators::counting_iterator<int,boost::use_default,boost::use_default>>const>const>,mpl_::bool_<true>>
                              (local_1540,local_15e0,
                               (type2type<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>,_mpl_::bool_<true>_>
                                *)0x0);
            local_1a69 = bVar1 ^ 0xff;
          }
          if ((local_1a69 & 1) == 0) break;
          bVar1 = boost::foreach_detail_::set_false(&local_1679);
          if (!bVar1) {
            piVar14 = boost::foreach_detail_::
                      deref<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::iterator_range<boost::iterators::counting_iterator<int,boost::use_default,boost::use_default>>const>const>,mpl_::bool_<true>>
                                (local_1540,
                                 (type2type<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>,_mpl_::bool_<true>_>
                                  *)0x0);
            local_1680 = *piVar14;
            while (((local_1679 ^ 0xffU) & 1) != 0) {
              pmVar15 = std::
                        map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                        ::operator[](contrib,&local_1680);
              std::vector<int,_std::allocator<int>_>::push_back(pmVar15,&local_1680);
              local_1679 = true;
            }
          }
          if ((local_1679 & 1U) != 0) {
            boost::foreach_detail_::
            next<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::range_detail::filtered_range<boost::_bi::bind_t<bool,boost::_mfi::cmf1<bool,trimesh::mscomplex_t,int>,boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>>,boost::arg<1>>>,boost::iterator_range<boost::iterators::counting_iterator<int,boost::use_default,boost::use_default>>const>const>,mpl_::bool_<true>>
                      (local_1540,
                       (type2type<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>,_mpl_::bool_<true>_>
                        *)0x0);
          }
        }
      }
      boost::foreach_detail_::
      auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>
      ::~auto_any((auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>
                   *)&cp);
    }
    boost::foreach_detail_::
    auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>
    ::~auto_any((auto_any<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>
                 *)&_foreach_end697);
  }
  boost::foreach_detail_::
  auto_any<boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::filtered_range<boost::_bi::bind_t<bool,_boost::_mfi::cmf1<bool,_trimesh::mscomplex_t,_int>,_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::iterator_range<boost::iterators::counting_iterator<int,_boost::use_default,_boost::use_default>_>_>_>_>
  ::~auto_any(&local_12c0);
  boost::range_detail::
  filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::~filtered_range((filtered_range<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::range_detail::transformed_range<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_const_boost::adaptors::sliced_range<std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
                     *)local_130);
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::~map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
          *)((long)&canc_rng.
                    super_iterator_range<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>_>
                    .
                    super_iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::bidirectional_traversal_tag>
                    .
                    super_iterator_range_base<boost::iterators::filter_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<bool,_bool_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_bool>,_boost::iterators::transform_iterator<boost::range_detail::default_constructible_unary_fn_wrapper<boost::_bi::bind_t<std::pair<int,_int>,_std::pair<int,_int>_(*)(boost::shared_ptr<trimesh::mscomplex_t>,_std::pair<int,_int>),_boost::_bi::list2<boost::_bi::value<boost::shared_ptr<trimesh::mscomplex_t>_>,_boost::arg<1>_>_>,_std::pair<int,_int>_>,___gnu_cxx::__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>,_boost::use_default,_boost::use_default>_>,_boost::iterators::incrementable_traversal_tag>
                    .m_End.m_end.m_f + 0x18));
  return;
}

Assistant:

void get_contrib_cps(mscomplex_ptr_t msc,contrib_t& contrib)
{
  const eGDIR odir = (dir == ASC)?(DES):(ASC);
  const int   odim = (dir == ASC)?(dim +1):(dim -1);

  contrib_t contrib_map;

  // first, obtain a sequence of cancellations so that
  // a) each pair is ordered by dir ..
  //    i.e if dir is DES then look at a (2,1) as (2,1) and not (1,2)
  // b) pairs that have not yet been cancelled are removed
  // c) pairs whose first element have index == dim

  BOOST_AUTO(canc_rng,msc->m_canc_list
             |badpt::sliced(0,msc->m_multires_version)
             |badpt::transformed(bind(order_by_dir_index<dir>,msc,_1))
             |badpt::filtered(bind(is_dim_pair<dim,odim>,msc,_1))
             );

  // This part computes for each cancelled critical point,
  // the surviving critical points to which it contributes its
  // finest resolution geometry .
  BOOST_FOREACH(int_pair_t pr,canc_rng|badpt::reversed)
  {
    int p = pr.first,q = pr.second;

    int_list_t & pcontrib = contrib_map[p];

    // for each qa in the asc conn of q:
    BOOST_FOREACH(int qa, msc->m_conn[odir][q])
    {
      // a) if qa is not paired ..
      if(msc->is_not_paired(qa))
      {
        // .. p contributes to qa.
        pcontrib.push_back(qa);
      }
      // b) if qa is paired and qa's pair and q have same index ..
      else if(msc->index(q) == msc->index(msc->pair_idx(qa)))
      {
        // .. then foreach qaqa that qa contributes to  ..
        BOOST_FOREACH(int qaqa,contrib_map[qa])
        {
          // .. p contributes to qaqa.
          pcontrib.push_back(qaqa);

          // pdpd has to be a surviving cp
          ASSERT(msc->is_not_paired(qaqa));
        }
      }
    }
  }

  // This part just reverses info computed earlier.
  // i.e each surviving critical point will have a
  // list of cancelled critical points that contribute
  // their finest res geometry to it.

  BOOST_FOREACH(int_pair_t pr, canc_rng)
  {
    int p = pr.first;

    BOOST_FOREACH(int p_, contrib_map[p])
    {
      contrib[p_].push_back(p);
    }
  }

  // Sanity checks.
  BOOST_FOREACH(contrib_t::value_type pr, contrib)
  {
    ENSURE(msc->index(pr.first) == dim,
           "Computed the contribution of index != dim");
    ENSURE(msc->is_not_paired(pr.first),
           "Computed the contribution to a cancelled cp");

    BOOST_FOREACH(int ccp, pr.second)
    {
      ENSURE(msc->index(ccp) == dim,
             "other dim cp is attempting to contribute");
      ENSURE(msc->is_paired(ccp),
             "an unpaired cp is attempting to contribute");
      ENSURE(msc->index(msc->pair_idx(ccp)) == odim,
             "wrong cancellation type cp is attempting to contribute");
    }
  }

  // finally add each cp to its own list of contributors
  BOOST_FOREACH(int cp, msc->cp_range()
                |badpt::filtered(bind(&mscomplex_t::is_not_paired,msc,_1))
                |badpt::filtered(bind(&mscomplex_t::is_index_i_cp<dim>,msc,_1)))
  {
    contrib[cp].push_back(cp);
  }
}